

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singlebsdf.cpp
# Opt level: O2

Color __thiscall SingleBSDF::f(SingleBSDF *this,vec3f *wo,vec3f *wi,HitInfo *hit)

{
  vec3f *pvVar1;
  float fVar2;
  BxDF *pBVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar14;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar15;
  Color CVar16;
  vec3f wiL;
  vec3f woL;
  vec3f N2;
  vec3f N1;
  undefined8 local_80;
  float local_78;
  undefined8 local_70;
  float local_68;
  undefined8 local_60;
  float local_58;
  vec3f local_50;
  vec3f local_40;
  
  if (this->component != (BxDF *)0x0) {
    local_40.x = 0.0;
    local_40.y = 0.0;
    local_40.z = 0.0;
    local_50.x = 0.0;
    local_50.y = 0.0;
    local_50.z = 0.0;
    pvVar1 = &(hit->super_Hit).Ns;
    BSDF::getLocalBasis(pvVar1,&local_40,&local_50);
    fVar10 = local_40.z;
    fVar6 = local_50.z;
    fVar12 = wo->x;
    fVar13 = wo->y;
    fVar2 = wo->z;
    fVar8 = local_40.x;
    fVar9 = local_40.y;
    fVar4 = local_50.x;
    fVar5 = local_50.y;
    local_68 = dot(wo,pvVar1);
    fVar11 = local_40.z;
    fVar7 = local_50.z;
    local_70 = CONCAT44(fVar2 * fVar6 + fVar12 * fVar4 + fVar13 * fVar5,
                        fVar2 * fVar10 + fVar12 * fVar8 + fVar13 * fVar9);
    fVar12 = wi->x;
    fVar13 = wi->y;
    fVar2 = wi->z;
    fVar6 = local_40.x;
    fVar8 = local_40.y;
    fVar4 = local_50.x;
    fVar5 = local_50.y;
    local_78 = dot(wi,pvVar1);
    local_80 = CONCAT44(fVar2 * fVar7 + fVar12 * fVar4 + fVar13 * fVar5,
                        fVar2 * fVar11 + fVar12 * fVar6 + fVar13 * fVar8);
    pvVar1 = &(hit->super_Hit).Ng;
    fVar12 = dot(wo,pvVar1);
    fVar13 = dot(wi,pvVar1);
    local_58 = 0.0;
    pBVar3 = this->component;
    if ((pBVar3->flags & (-(uint)(0.0 < fVar13 != 0.0 < fVar12) & 1) * 2 + REFLECT) == 0) {
      uVar14 = 0;
      uVar15 = 0;
    }
    else {
      CVar16 = BSDF::albedo(&this->super_BSDF,&(hit->super_Hit).uv);
      local_58 = CVar16.z;
      local_60 = CVar16._0_8_;
      (**pBVar3->_vptr_BxDF)(pBVar3,&local_60,&local_70,&local_80);
      uVar14 = extraout_XMM0_Da;
      uVar15 = extraout_XMM0_Db;
    }
    CVar16.y = (float)uVar15;
    CVar16.x = (float)uVar14;
    CVar16.z = local_58;
    return CVar16;
  }
  return (Color)ZEXT812(0);
}

Assistant:

Color SingleBSDF::f(const vec3f& wo, const vec3f& wi, const HitInfo& hit) const
{
	if (component == NULL) return Color(0);
	vec3f N1,N2;
	getLocalBasis(hit.Ns, N1, N2);
	// transform wo, wi to local surface Ns' = (0,0,1)
	vec3f woL = vec3f(dot(wo,N1), dot(wo,N2), dot(wo,hit.Ns));
	vec3f wiL = vec3f(dot(wi,N1), dot(wi,N2), dot(wi,hit.Ns));
	// use Ng to determine whether BRDF or BTDF is used
	bool through = (dot(wo, hit.Ng)>0) ^ (dot(wi, hit.Ng)>0);
	BxDF::Type allowed = through? BxDF::TRANSMIT : BxDF::REFLECT;
	return (component->flags & allowed)? component->f(albedo(hit.uv), woL, wiL): 0;
}